

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O3

ChStrainTensor<double> * __thiscall
chrono::fea::ChElementHexaCorot_8::GetStrain
          (ChStrainTensor<double> *__return_storage_ptr__,ChElementHexaCorot_8 *this,double z1,
          double z2,double z3)

{
  int iVar1;
  uint uVar2;
  ChVectorDynamic<> displ;
  ChMatrixDynamic<> amatrB;
  double JacobianDet;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_78;
  DenseStorage<double,__1,__1,__1,_1> local_68;
  double local_50;
  double local_48;
  double local_40;
  undefined1 local_38 [8];
  DenseStorage<double,__1,__1,__1,_1> *local_30;
  undefined1 *local_28;
  
  local_50 = z1;
  local_48 = z2;
  local_40 = z3;
  iVar1 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
  local_78.m_storage.m_data = (double *)0x0;
  local_78.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_78,(long)iVar1);
  (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[0xb])(this,&local_78);
  uVar2 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
  local_68.m_cols = 0;
  local_68.m_data = (double *)0x0;
  local_68.m_rows = 0;
  if ((int)uVar2 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_68,(ulong)uVar2 * 6,6,(ulong)uVar2);
  (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[0xd])
            (local_50,local_48,local_40,this,&local_68,local_38);
  if (local_68.m_cols == local_78.m_storage.m_rows) {
    local_30 = &local_68;
    local_28 = (undefined1 *)&local_78;
    ChVoightTensor<double>::
    ChVoightTensor<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              (&__return_storage_ptr__->super_ChVoightTensor<double>,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_30);
    if (local_68.m_data != (double *)0x0) {
      free((void *)local_68.m_data[-1]);
    }
    if (local_78.m_storage.m_data != (double *)0x0) {
      free((void *)local_78.m_storage.m_data[-1]);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
               );
}

Assistant:

ChStrainTensor<> ChElementHexaCorot_8::GetStrain(double z1, double z2, double z3) {
    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(GetNdofs());
    this->GetStateBlock(displ);

    double JacobianDet;
    ChMatrixDynamic<> amatrB(6, GetNdofs());
    ComputeMatrB(amatrB, z1, z2, z3, JacobianDet);

    ChStrainTensor<> mstrain = amatrB * displ;
    return mstrain;
}